

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

char * stringify(char *str,VARR_char *to)

{
  char cVar1;
  byte bVar2;
  FILE *__stream;
  pos_t pVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  byte bVar8;
  uint uVar9;
  int iVar10;
  c2m_ctx_t pcVar11;
  char *pcVar12;
  int *piVar13;
  node_t_conflict n;
  uint uVar14;
  int iVar15;
  size_t sVar16;
  int extraout_EDX;
  size_t sVar17;
  char *pcVar18;
  ulong uVar19;
  VARR_char *unaff_RBX;
  char *__s1;
  VARR_char *pVVar20;
  int iVar21;
  c2m_ctx_t c2m_ctx;
  code *pcVar22;
  size_t sVar23;
  VARR_char *pVVar24;
  longdouble in_ST0;
  float fVar25;
  double dVar26;
  int iStack_94;
  int *piStack_90;
  uint uStack_88;
  int iStack_84;
  tab_str_t tStack_78;
  VARR_char *pVStack_58;
  
  pVVar20 = to;
  c2m_ctx = (c2m_ctx_t)str;
  if ((to != (VARR_char *)0x0) &&
     (pcVar11 = (c2m_ctx_t)to->varr, unaff_RBX = to, pcVar11 != (c2m_ctx_t)0x0)) {
    to->els_num = 0;
    if (to->size == 0) {
      pVVar20 = (VARR_char *)&DAT_00000001;
      c2m_ctx = pcVar11;
      pcVar11 = (c2m_ctx_t)realloc(pcVar11,1);
      to->varr = (char *)pcVar11;
      to->size = 1;
      sVar16 = to->els_num;
      sVar17 = sVar16 + 1;
    }
    else {
      sVar17 = 1;
      sVar16 = 0;
    }
    to->els_num = sVar17;
    *(undefined1 *)((long)pcVar11->env[0].__jmpbuf + (sVar16 - 0x10)) = 0x22;
    while( true ) {
      cVar1 = *str;
      if ((cVar1 == '\"') || (cVar1 == '\\')) {
        pcVar11 = (c2m_ctx_t)to->varr;
        if (pcVar11 == (c2m_ctx_t)0x0) goto LAB_0019011c;
        sVar17 = to->els_num;
        uVar19 = sVar17 + 1;
        if (to->size < uVar19) {
          pVVar24 = (VARR_char *)((uVar19 >> 1) + uVar19);
          pVVar20 = pVVar24;
          c2m_ctx = pcVar11;
          pcVar11 = (c2m_ctx_t)realloc(pcVar11,(size_t)pVVar24);
          to->varr = (char *)pcVar11;
          to->size = (size_t)pVVar24;
          sVar17 = to->els_num;
          uVar19 = sVar17 + 1;
        }
        to->els_num = uVar19;
        *(undefined1 *)((long)pcVar11->env[0].__jmpbuf + (sVar17 - 0x10)) = 0x5c;
        cVar1 = *str;
      }
      else if (cVar1 == '\0') {
        pcVar12 = to->varr;
        if (pcVar12 != (char *)0x0) {
          sVar17 = to->els_num;
          uVar19 = sVar17 + 1;
          if (to->size < uVar19) {
            sVar23 = (uVar19 >> 1) + uVar19;
            pcVar12 = (char *)realloc(pcVar12,sVar23);
            to->varr = pcVar12;
            to->size = sVar23;
            sVar17 = to->els_num;
            uVar19 = sVar17 + 1;
          }
          to->els_num = uVar19;
          pcVar12[sVar17] = '\"';
          return pcVar12;
        }
        goto LAB_00190126;
      }
      pcVar11 = (c2m_ctx_t)to->varr;
      if (pcVar11 == (c2m_ctx_t)0x0) break;
      sVar17 = to->els_num;
      uVar19 = sVar17 + 1;
      if (to->size < uVar19) {
        pVVar24 = (VARR_char *)((uVar19 >> 1) + uVar19);
        pVVar20 = pVVar24;
        c2m_ctx = pcVar11;
        pcVar11 = (c2m_ctx_t)realloc(pcVar11,(size_t)pVVar24);
        to->varr = (char *)pcVar11;
        to->size = (size_t)pVVar24;
        sVar17 = to->els_num;
        uVar19 = sVar17 + 1;
      }
      to->els_num = uVar19;
      *(char *)((long)pcVar11->env[0].__jmpbuf + (sVar17 - 0x10)) = cVar1;
      str = str + 1;
    }
    stringify_cold_3();
LAB_0019011c:
    stringify_cold_1();
  }
  stringify_cold_4();
LAB_00190126:
  stringify_cold_2();
  uVar14 = (uint)pVVar20->els_num;
  uVar9 = (uVar14 & 0xffff) - 0x13d;
  pVStack_58 = unaff_RBX;
  if (uVar9 < 0xb) {
    if (uVar9 == 2) {
      uVar14 = uVar14 & 0xffff0103;
      *(uint *)&pVVar20->els_num = uVar14;
    }
    else if ((0x7f3U >> (uVar9 & 0x1f) & 1) != 0) {
      __assert_fail("t->code != T_HEADER && t->code != T_BOA && t->code != T_EOA && t->code != T_EOR && t->code != T_EOP && t->code != T_EOFILE && t->code != T_EOU && t->code != T_PLM && t->code != T_RDBLNO"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x732,"token_t pptoken2token(c2m_ctx_t, token_t, int)");
    }
  }
  iVar15 = uVar14 << 0x10;
  if (extraout_EDX != 0 && iVar15 == 0x1030000) {
    pcVar12 = pVVar20[1].varr;
    sVar23 = strlen(pcVar12);
    str_add(&tStack_78,c2m_ctx,pcVar12,sVar23 + 1,0x102,0,0);
    if (tStack_78.key == 0x102) {
      return (char *)pVVar20;
    }
    *(short *)&pVVar20->els_num = (short)tStack_78.key;
    *(undefined4 *)&pVVar20[1].els_num = 0;
    pVVar20[1].size = 0;
    return (char *)pVVar20;
  }
  if (iVar15 == 0xa0000) {
    return (char *)0x0;
  }
  if (iVar15 == 0x200000) {
    return (char *)0x0;
  }
  if (iVar15 != 0x1000000) {
    return (char *)pVVar20;
  }
  pcVar12 = pVVar20[1].varr;
  sVar23 = strlen(pcVar12);
  uVar14 = (uint)sVar23;
  if ((int)uVar14 < 1) {
    __assert_fail("last >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x746,"token_t pptoken2token(c2m_ctx_t, token_t, int)");
  }
  bVar5 = false;
  pcVar18 = pcVar12;
  if (*pcVar12 == '0') {
    bVar2 = pcVar12[1];
    bVar4 = true;
    iStack_84 = 0x10;
    bVar8 = 0;
    if (bVar2 < 0x62) {
      if (bVar2 == 0x42) {
LAB_0019026d:
        pcVar22 = error;
        if (c2m_ctx->options->pedantic_p == 0) {
          pcVar22 = warning;
        }
        bVar4 = false;
        (*pcVar22)(c2m_ctx,pVVar20->size,pVVar20->varr,"binary number is not a standard: %s",pcVar12
                  );
        bVar8 = 1;
        iStack_84 = 2;
        pcVar18 = pcVar12 + 2;
      }
      else {
        bVar8 = 0;
        if (bVar2 != 0x58) {
LAB_001905dd:
          iStack_84 = 8;
          goto LAB_00190253;
        }
      }
    }
    else if (bVar2 != 0x78) {
      if (bVar2 != 0x62) goto LAB_001905dd;
      goto LAB_0019026d;
    }
  }
  else {
    iStack_84 = 10;
LAB_00190253:
    bVar8 = 1;
    bVar4 = false;
  }
  uStack_88 = uVar14 - 1;
  uVar19 = 0;
  do {
    bVar2 = pcVar12[uVar19];
    if (bVar2 < 0x65) {
      if ((bVar2 == 0x2e) || (bVar2 == 0x50)) goto LAB_001902f5;
LAB_001902e8:
      if ((bool)(bVar8 & bVar2 == 0x45)) goto LAB_001902f5;
    }
    else {
      if (bVar2 == 0x65) {
        if (bVar4) goto LAB_001902fb;
      }
      else if (bVar2 != 0x70) goto LAB_001902e8;
LAB_001902f5:
      bVar5 = true;
    }
LAB_001902fb:
    uVar19 = uVar19 + 1;
  } while ((uVar14 & 0x7fffffff) != uVar19);
  if ((int)uVar14 < 3) {
    if (uVar14 == 1) goto LAB_0019040b;
LAB_00190455:
    uVar19 = (ulong)(uVar14 - 2);
    cVar1 = pcVar12[uVar19];
    if (cVar1 == 'L') {
      if ((pcVar12[uVar19 + 1] == 'L') && (pcVar12[uVar19 + 2] == '\0')) {
LAB_0019069f:
        iVar15 = 1;
        bVar4 = true;
        bVar2 = 0;
        iVar21 = -3;
        piStack_90._0_4_ = 0;
        iStack_94 = 0;
        bVar8 = 1;
        goto LAB_0019072c;
      }
      bVar6 = false;
      bVar4 = false;
      if (pcVar12[uVar19 + 1] != 'U') goto LAB_001906c4;
      if (pcVar12[uVar19 + 2] != '\0') {
        bVar6 = false;
        goto LAB_0019069b;
      }
LAB_0019071b:
      piStack_90._0_4_ = 1;
      bVar4 = false;
      bVar2 = 1;
      iVar21 = -3;
      iStack_94 = 1;
LAB_00190728:
      bVar8 = 0;
      iVar15 = 0;
      goto LAB_0019072c;
    }
    if (cVar1 == 'U') {
      if (pcVar12[uVar19 + 1] == 'L') {
        if (pcVar12[uVar19 + 2] != '\0') {
          bVar6 = true;
LAB_0019069b:
          bVar4 = false;
          goto LAB_001906c4;
        }
      }
      else {
LAB_001906f6:
        if ((pcVar12[uVar19 + 1] != 'l') || (pcVar12[uVar19 + 2] != '\0')) goto LAB_0019040b;
      }
      goto LAB_0019071b;
    }
    if (cVar1 != 'u') {
      if (cVar1 != 'l') goto LAB_0019040b;
      if ((pcVar12[uVar19 + 1] == 'l') && (pcVar12[uVar19 + 2] == '\0')) goto LAB_0019069f;
      bVar6 = false;
      if (pcVar12[uVar19 + 1] == 'u') {
        bVar4 = true;
        if (pcVar12[uVar19 + 2] == '\0') goto LAB_0019071b;
        bVar6 = false;
      }
      else {
        bVar4 = true;
      }
LAB_001906c4:
      if (((cVar1 != 'L') || (pcVar12[uVar19 + 1] != 'u')) || (pcVar12[uVar19 + 2] != '\0'))
      goto LAB_001906d9;
      goto LAB_0019071b;
    }
    if ((pcVar12[uVar19 + 1] == 'l') && (pcVar12[uVar19 + 2] == '\0')) goto LAB_0019071b;
    iVar15 = 0;
    bVar6 = false;
    bVar4 = false;
    if (pcVar12[uVar19 + 1] == 'L') {
      if (pcVar12[uVar19 + 2] == '\0') {
        piStack_90._0_4_ = 1;
        bVar2 = 1;
        iVar21 = -3;
        bVar4 = false;
        iStack_94 = 1;
        bVar8 = 0;
        goto LAB_0019072c;
      }
    }
    else {
LAB_001906d9:
      if (((bVar4) && (pcVar12[uVar19 + 1] == 'U')) && (pcVar12[uVar19 + 2] == '\0'))
      goto LAB_0019071b;
      if (bVar6) goto LAB_001906f6;
    }
LAB_0019040b:
    bVar2 = pcVar12[uStack_88];
    if (0x6b < bVar2) {
      if (bVar2 == 0x6c) goto LAB_001904da;
      if (bVar2 != 0x75) goto LAB_001904e6;
      if (pcVar12[(ulong)uStack_88 + 1] == '\0') goto LAB_001905ea;
      if (!bVar5) goto LAB_001905d0;
      goto LAB_001907b3;
    }
    if (bVar2 == 0x4c) {
LAB_001904da:
      if (pcVar12[(ulong)uStack_88 + 1] != '\0') goto LAB_001904e6;
      iStack_94 = 1;
      bVar2 = 0;
      iVar21 = -2;
      piStack_90._0_4_ = 0;
      bVar4 = false;
      goto LAB_00190728;
    }
    if ((bVar2 == 0x55) && (pcVar12[(ulong)uStack_88 + 1] == '\0')) {
LAB_001905ea:
      iStack_94 = 0;
      piStack_90._0_4_ = 1;
      bVar2 = 1;
      iVar21 = -2;
      bVar4 = true;
      goto LAB_00190728;
    }
LAB_001904e6:
    if (bVar5) {
      if (((bVar2 == 0x66) || (bVar2 == 0x46)) && (pcVar12[(ulong)uStack_88 + 1] == '\0')) {
        uStack_88 = uVar14 - 2;
        piStack_90 = __errno_location();
        *piStack_90 = 0;
        fVar25 = strtof(pcVar18,(char **)&tStack_78);
        pVar3 = *(pos_t *)&pVVar20->size;
        n = new_node(c2m_ctx,N_F);
        add_pos(c2m_ctx,n,pVar3);
        bVar2 = 1;
        bVar7 = 0;
        bVar8 = 0;
        (n->u).f = fVar25;
        goto LAB_0019084f;
      }
      goto LAB_001907b3;
    }
LAB_001905d0:
    piStack_90._0_4_ = 0;
    iStack_94 = 0;
    iVar15 = 0;
LAB_0019076b:
    piVar13 = __errno_location();
    *piVar13 = 0;
    n = get_int_node_from_repr
                  (c2m_ctx,pcVar18,(char **)&tStack_78,iStack_84,(int)piStack_90,iStack_94,iVar15,
                   *(pos_t *)&pVVar20->size);
    bVar7 = 0;
    piStack_90 = piVar13;
LAB_0019084b:
    bVar8 = 0;
  }
  else {
    __s1 = pcVar12 + (uVar14 - 3);
    iVar15 = strcmp(__s1,"LLU");
    bVar2 = 1;
    iVar21 = -4;
    iStack_94 = 0;
    piStack_90._0_4_ = 1;
    if (iVar15 == 0) {
      bVar4 = true;
      bVar8 = 1;
      iVar15 = 1;
    }
    else {
      iVar15 = strcmp(__s1,"ULL");
      if ((((iVar15 == 0) || (iVar15 = strcmp(__s1,"llu"), iVar15 == 0)) ||
          (iVar15 = strcmp(__s1,"ull"), iVar15 == 0)) ||
         (((iVar15 = strcmp(__s1,"LLu"), iVar15 == 0 || (iVar15 = strcmp(__s1,"uLL"), iVar15 == 0))
          || (iVar15 = strcmp(__s1,"llU"), iVar15 == 0)))) {
        bVar4 = true;
        bVar8 = 1;
        iVar15 = 1;
        bVar2 = 1;
        iVar21 = -4;
      }
      else {
        iVar10 = strcmp(__s1,"Ull");
        bVar4 = true;
        bVar8 = 1;
        iVar15 = 1;
        bVar2 = 1;
        iVar21 = -4;
        if (iVar10 != 0) goto LAB_00190455;
      }
    }
LAB_0019072c:
    uStack_88 = iVar21 + uVar14;
    if (!bVar5) goto LAB_0019076b;
    if (!(bool)(bVar2 | bVar8)) {
      if (bVar4) goto LAB_001907b3;
      piStack_90 = __errno_location();
      *piStack_90 = 0;
      strtold(pcVar18,(char **)&tStack_78);
      n = new_ld_node(c2m_ctx,in_ST0,*(pos_t *)&pVVar20->size);
      bVar7 = 1;
      goto LAB_0019084b;
    }
    error(c2m_ctx,0x1c11e6,(char *)pVVar20->size,pVVar20->varr,pcVar12);
LAB_001907b3:
    piStack_90 = __errno_location();
    *piStack_90 = 0;
    dVar26 = strtod(pcVar18,(char **)&tStack_78);
    pVar3 = *(pos_t *)&pVVar20->size;
    n = new_node(c2m_ctx,N_D);
    add_pos(c2m_ctx,n,pVar3);
    bVar8 = 1;
    bVar7 = 0;
    (n->u).d = dVar26;
  }
  bVar2 = 0;
LAB_0019084f:
  pVVar20[1].size = (size_t)n;
  if (tStack_78.str.s == pcVar12 + (long)(int)uStack_88 + 1) {
    if (*piStack_90 != 0) {
      if ((bool)(bVar7 | bVar8 | bVar2)) {
        warning(c2m_ctx,0x1c1201,(char *)pVVar20->size,pVVar20->varr,pVVar20[1].varr);
      }
      else {
        pcVar22 = error;
        if (c2m_ctx->options->pedantic_p == 0) {
          pcVar22 = warning;
        }
        (*pcVar22)(c2m_ctx,pVVar20->size,pVVar20->varr,"number %s is out of range",pVVar20[1].varr);
      }
    }
  }
  else {
    __stream = (FILE *)c2m_ctx->options->message_file;
    if (__stream != (FILE *)0x0) {
      fprintf(__stream,"%s:%s:%s\n",pcVar12);
    }
    error(c2m_ctx,0x1c11e6,(char *)pVVar20->size,pVVar20->varr,pVVar20[1].varr);
  }
  return (char *)pVVar20;
}

Assistant:

static const char *stringify (const char *str, VARR (char) * to) {
  VARR_TRUNC (char, to, 0);
  VARR_PUSH (char, to, '"');
  for (; *str != '\0'; str++) {
    if (*str == '\"' || *str == '\\') VARR_PUSH (char, to, '\\');
    VARR_PUSH (char, to, *str);
  }
  VARR_PUSH (char, to, '"');
  return VARR_ADDR (char, to);
}